

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void __thiscall
icu_63::SpoofImpl::addScriptChars
          (SpoofImpl *this,char *locale,UnicodeSet *allowedChars,UErrorCode *status)

{
  UBool UVar1;
  int local_10c;
  undefined1 local_108 [4];
  int32_t i;
  UnicodeSet tmpSet;
  UScriptCode local_a8;
  int32_t numScripts;
  UScriptCode scripts [30];
  UErrorCode *status_local;
  UnicodeSet *allowedChars_local;
  char *locale_local;
  SpoofImpl *this_local;
  
  tmpSet._84_4_ = uscript_getCode_63(locale,&local_a8,0x1e,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (*status == U_USING_DEFAULT_WARNING) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UnicodeSet::UnicodeSet((UnicodeSet *)local_108);
      for (local_10c = 0; local_10c < (int)tmpSet._84_4_; local_10c = local_10c + 1) {
        UnicodeSet::applyIntPropertyValue
                  ((UnicodeSet *)local_108,UCHAR_SCRIPT,(&local_a8)[local_10c],status);
        UnicodeSet::addAll(allowedChars,(UnicodeSet *)local_108);
      }
      UnicodeSet::~UnicodeSet((UnicodeSet *)local_108);
    }
  }
  return;
}

Assistant:

void SpoofImpl::addScriptChars(const char *locale, UnicodeSet *allowedChars, UErrorCode &status) {
    UScriptCode scripts[30];

    int32_t numScripts = uscript_getCode(locale, scripts, UPRV_LENGTHOF(scripts), &status);
    if (U_FAILURE(status)) {
        return;
    }
    if (status == U_USING_DEFAULT_WARNING) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    UnicodeSet tmpSet;
    int32_t    i;
    for (i=0; i<numScripts; i++) {
        tmpSet.applyIntPropertyValue(UCHAR_SCRIPT, scripts[i], status);
        allowedChars->addAll(tmpSet);
    }
}